

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SSLPending_Test::TestBody(SSLVersionTest_SSLPending_Test *this)

{
  UniquePtr<SSL> *out_client;
  UniquePtr<SSL> *out_server;
  bool bVar1;
  ParamType *pPVar2;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  long *plVar3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr_2;
  pointer *__ptr_5;
  char buf [10];
  UniquePtr<SSL> ssl;
  AssertHelper local_a8;
  AssertHelper local_a0;
  Message local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type sStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  _Head_base<0UL,_ssl_st_*,_false> local_30;
  
  local_30._M_head_impl =
       (ssl_st *)
       SSL_new((SSL_CTX *)
               (this->super_SSLVersionTest).client_ctx_._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  local_98.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_98.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,(SSL *)local_30._M_head_impl != (SSL *)0x0);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((SSL *)local_30._M_head_impl == (SSL *)0x0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_98,(AssertionResult *)0x3422b7,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x170c,(char *)local_88);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_88 != (undefined1  [8])&local_78) {
      operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
    }
    __ptr_00 = local_90;
    if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
      __ptr_00 = local_90;
    }
joined_r0x001a51e0:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_90;
    local_90 = __ptr_00;
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001a605f;
  }
  else {
    local_98.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    local_a8.data_._0_4_ = SSL_pending((SSL *)local_30._M_head_impl);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"0","SSL_pending(ssl.get())",(int *)&local_98,(int *)&local_a8);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message(&local_98);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x170d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a8,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((long *)CONCAT44(local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_98.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_78._8_8_ = 0;
    local_68._8_8_ = 0;
    sStack_50 = 0;
    local_48._8_8_ = 0;
    local_88 = (undefined1  [8])0x0;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68._M_allocated_capacity = 0;
    local_48._M_allocated_capacity = 0;
    local_38._0_4_ = 0;
    local_38._4_1_ = false;
    local_38._5_3_ = 0;
    out_client = &(this->super_SSLVersionTest).client_;
    out_server = &(this->super_SSLVersionTest).server_;
    bVar1 = (this->super_SSLVersionTest).shed_handshake_config_;
    pcVar4 = (char *)(ulong)bVar1;
    local_78._M_allocated_capacity = (size_type)&local_68;
    local_58._M_p = (pointer)&local_48;
    bVar1 = ConnectClientAndServer
                      (out_client,out_server,
                       (this->super_SSLVersionTest).client_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (this->super_SSLVersionTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (ClientConfig *)local_88,bVar1);
    local_98.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_98.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,bVar1);
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if (local_98.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_98,(AssertionResult *)"Connect()","false",
                 "true",pcVar4);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x170f,(char *)local_88);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_88 != (undefined1  [8])&local_78) {
        operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
      }
      __ptr_00 = local_90;
      if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
        __ptr_00 = local_90;
      }
      goto joined_r0x001a51e0;
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_98.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    local_a8.data_._0_4_ =
         SSL_pending((SSL *)(out_client->_M_t).
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"0","SSL_pending(client_.get())",(int *)&local_98,
               (int *)&local_a8);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message(&local_98);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1710,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a8,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((long *)CONCAT44(local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_98.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_98.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    local_a8.data_._0_4_ =
         SSL_has_pending((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"0","SSL_has_pending(client_.get())",(int *)&local_98,
               (int *)&local_a8);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message(&local_98);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1711,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a8,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((long *)CONCAT44(local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_98.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_98.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 5;
    local_a8.data_._0_4_ =
         SSL_write((SSL *)(out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,"hello",5);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"5","SSL_write(server_.get(), \"hello\", 5)",(int *)&local_98,
               (int *)&local_a8);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message(&local_98);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1713,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a8,&local_98);
LAB_001a56bc:
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      plVar3 = (long *)CONCAT44(local_98.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                                local_98.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._0_4_);
LAB_001a6040:
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    else {
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 5;
      local_a8.data_._0_4_ =
           SSL_write((SSL *)(out_server->_M_t).
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,"world",5);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"5","SSL_write(server_.get(), \"world\", 5)",(int *)&local_98,
                 (int *)&local_a8);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message(&local_98);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1714,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a8,&local_98);
        goto LAB_001a56bc;
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      local_a8.data_._0_4_ =
           SSL_pending((SSL *)(out_client->_M_t).
                              super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"0","SSL_pending(client_.get())",(int *)&local_98,
                 (int *)&local_a8);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message(&local_98);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1715,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a8,&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if ((long *)CONCAT44(local_98.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             local_98.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_98.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_) + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0;
      local_a8.data_._0_4_ =
           SSL_has_pending((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"0","SSL_has_pending(client_.get())",(int *)&local_98,
                 (int *)&local_a8);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message(&local_98);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1716,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a8,&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if ((long *)CONCAT44(local_98.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             local_98.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_98.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_) + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 1;
      local_a0.data_._0_4_ =
           SSL_peek((SSL *)(out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&local_98,1);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"1","SSL_peek(client_.get(), buf, 1)",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1719,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
LAB_001a6032:
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        plVar3 = (long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_);
        goto LAB_001a6040;
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 5;
      local_a0.data_._0_4_ =
           SSL_pending((SSL *)(out_client->_M_t).
                              super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"5","SSL_pending(client_.get())",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x171a,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 1;
      local_a0.data_._0_4_ =
           SSL_has_pending((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"1","SSL_has_pending(client_.get())",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x171b,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 1;
      local_a0.data_._0_4_ =
           SSL_read((SSL *)(out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&local_98,1);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"1","SSL_read(client_.get(), buf, 1)",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x171d,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        goto LAB_001a6032;
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 4;
      local_a0.data_._0_4_ =
           SSL_pending((SSL *)(out_client->_M_t).
                              super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"4","SSL_pending(client_.get())",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x171e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 1;
      local_a0.data_._0_4_ =
           SSL_has_pending((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"1","SSL_has_pending(client_.get())",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x171f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 4;
      local_a0.data_._0_4_ =
           SSL_read((SSL *)(out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&local_98,10);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"4","SSL_read(client_.get(), buf, 10)",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1721,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        goto LAB_001a6032;
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 0;
      local_a0.data_._0_4_ =
           SSL_pending((SSL *)(out_client->_M_t).
                              super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"0","SSL_pending(client_.get())",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1722,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      pPVar2 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
      if (pPVar2->ssl_method == is_dtls) {
        local_a8.data_._0_4_ = 1;
        local_a0.data_._0_4_ =
             SSL_has_pending((out_client->_M_t).
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"1","SSL_has_pending(client_.get())",(int *)&local_a8,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_a8);
          if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x172c,pcVar4);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
LAB_001a5e34:
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
          }
        }
      }
      else {
        local_a8.data_._0_4_ = 0;
        local_a0.data_._0_4_ =
             SSL_has_pending((out_client->_M_t).
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"0","SSL_has_pending(client_.get())",(int *)&local_a8,
                   (int *)&local_a0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_a8);
          if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar4 = "";
          }
          else {
            pcVar4 = (pbStack_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1730,pcVar4);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
          goto LAB_001a5e34;
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 2;
      local_a0.data_._0_4_ =
           SSL_read((SSL *)(out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&local_98,2);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"2","SSL_read(client_.get(), buf, 2)",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1733,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        goto LAB_001a6032;
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 3;
      local_a0.data_._0_4_ =
           SSL_pending((SSL *)(out_client->_M_t).
                              super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"3","SSL_pending(client_.get())",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1734,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,(int)local_a8.data_) + 8))();
        }
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
      local_a8.data_._0_4_ = 1;
      local_a0.data_._0_4_ =
           SSL_has_pending((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"1","SSL_has_pending(client_.get())",(int *)&local_a8,
                 (int *)&local_a0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = "";
        }
        else {
          pcVar4 = (pbStack_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1735,pcVar4);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
        goto LAB_001a6032;
      }
    }
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001a605f;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_80;
    __ptr_00 = pbStack_80;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_001a605f:
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_30);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SSLPending) {
  UniquePtr<SSL> ssl(SSL_new(client_ctx_.get()));
  ASSERT_TRUE(ssl);
  EXPECT_EQ(0, SSL_pending(ssl.get()));

  ASSERT_TRUE(Connect());
  EXPECT_EQ(0, SSL_pending(client_.get()));
  EXPECT_EQ(0, SSL_has_pending(client_.get()));

  ASSERT_EQ(5, SSL_write(server_.get(), "hello", 5));
  ASSERT_EQ(5, SSL_write(server_.get(), "world", 5));
  EXPECT_EQ(0, SSL_pending(client_.get()));
  EXPECT_EQ(0, SSL_has_pending(client_.get()));

  char buf[10];
  ASSERT_EQ(1, SSL_peek(client_.get(), buf, 1));
  EXPECT_EQ(5, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));

  ASSERT_EQ(1, SSL_read(client_.get(), buf, 1));
  EXPECT_EQ(4, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));

  ASSERT_EQ(4, SSL_read(client_.get(), buf, 10));
  EXPECT_EQ(0, SSL_pending(client_.get()));
  if (is_dtls()) {
    // In DTLS, the two records would have been read as a single datagram and
    // buffered inside |client_|. Thus, |SSL_has_pending| should return true.
    //
    // This test is slightly unrealistic. It relies on |ConnectClientAndServer|
    // using a |BIO| pair, which does not preserve datagram boundaries. Reading
    // 1 byte, then 4 bytes, from the first record also relies on
    // https://crbug.com/boringssl/65. But it does test the codepaths. When
    // fixing either of these bugs, this test may need to be redone.
    EXPECT_EQ(1, SSL_has_pending(client_.get()));
  } else {
    // In TLS, we do not overread, so |SSL_has_pending| should report no data is
    // buffered.
    EXPECT_EQ(0, SSL_has_pending(client_.get()));
  }

  ASSERT_EQ(2, SSL_read(client_.get(), buf, 2));
  EXPECT_EQ(3, SSL_pending(client_.get()));
  EXPECT_EQ(1, SSL_has_pending(client_.get()));
}